

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O2

int __thiscall gdscpp::calculate_STR_bounding_box(gdscpp *this,int structure_index,int *destination)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_00;
  int *piVar1;
  gdscpp *pgVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  int iVar6;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  pointer pgVar8;
  mapped_type *pmVar9;
  ostream *poVar10;
  long lVar11;
  long lVar12;
  gdsBOUNDARY *pgVar13;
  gdsBOX *pgVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  gdscpp *pgVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  double dVar24;
  undefined1 auVar27 [16];
  double dVar25;
  ulong uVar26;
  double extraout_XMM0_Qb;
  undefined1 auVar28 [16];
  uint uVar31;
  uint uVar35;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint uVar39;
  uint uVar40;
  int local_328;
  int iStack_324;
  int iStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined1 local_308 [12];
  uint uStack_2fc;
  undefined1 local_2f8 [12];
  uint uStack_2ec;
  double local_2e8;
  double dStack_2e0;
  long local_2d0;
  int STR_bound_box [4];
  POINT local_2b8;
  POINT local_2a8;
  POINT local_298;
  double local_288;
  int *local_278;
  gdscpp *local_270;
  POINT local_268;
  POINT local_258;
  undefined4 local_248;
  uint uStack_244;
  undefined4 uStack_240;
  uint uStack_23c;
  double local_238;
  double local_228;
  double local_218;
  undefined4 local_208;
  uint uStack_204;
  undefined4 uStack_200;
  uint uStack_1fc;
  double local_1f8;
  double local_1e8;
  undefined1 local_1d0 [208];
  undefined1 local_100 [208];
  int iVar29;
  int iVar30;
  
  lVar12 = (long)structure_index;
  pgVar8 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar5 = false;
  pgVar2 = (gdscpp *)(local_100 + 0x68);
  local_278 = destination;
  for (pgVar13 = *(gdsBOUNDARY **)
                  &pgVar8[lVar12].BOUNDARY.
                   super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl;
      pgVar13 !=
      *(pointer *)
       ((long)&pgVar8[lVar12].BOUNDARY.super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>
               ._M_impl + 8); pgVar13 = pgVar13 + 1) {
    if (bVar5) {
      pgVar18 = (gdscpp *)local_100;
      gdsBOUNDARY::gdsBOUNDARY((gdsBOUNDARY *)local_100,pgVar13);
      fetch_boundary_bounding_box(pgVar18,(gdsBOUNDARY *)local_100,STR_bound_box);
      gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_100);
      uVar26 = CONCAT44(-(uint)(SUB84(STR_bound_box._0_8_,4) < (int)(local_318 >> 0x20)),
                        -(uint)((int)STR_bound_box._0_8_ < (int)local_318));
      local_318 = ~uVar26 & local_318 | STR_bound_box._0_8_ & uVar26;
      uVar26 = CONCAT44(-(uint)((int)(uStack_310 >> 0x20) < SUB84(STR_bound_box._8_8_,4)),
                        -(uint)((int)uStack_310 < (int)STR_bound_box._8_8_));
      uStack_310 = ~uVar26 & uStack_310 | STR_bound_box._8_8_ & uVar26;
    }
    else {
      pgVar18 = pgVar2;
      gdsBOUNDARY::gdsBOUNDARY((gdsBOUNDARY *)pgVar2,pgVar13);
      fetch_boundary_bounding_box(pgVar18,(gdsBOUNDARY *)pgVar2,(int *)&local_318);
      gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)pgVar2);
      bVar5 = true;
    }
    pgVar8 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  pgVar2 = (gdscpp *)(local_1d0 + 0x68);
  for (pgVar14 = pgVar8[lVar12].BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pgVar14 !=
      *(pointer *)
       ((long)&pgVar8[lVar12].BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl + 8);
      pgVar14 = pgVar14 + 1) {
    if (bVar5) {
      pgVar18 = (gdscpp *)local_1d0;
      gdsBOX::gdsBOX((gdsBOX *)local_1d0,pgVar14);
      fetch_box_bounding_box(pgVar18,(gdsBOX *)local_1d0,STR_bound_box);
      gdsBOX::~gdsBOX((gdsBOX *)local_1d0);
      uVar26 = CONCAT44(-(uint)(SUB84(STR_bound_box._0_8_,4) < (int)(local_318 >> 0x20)),
                        -(uint)((int)STR_bound_box._0_8_ < (int)local_318));
      local_318 = ~uVar26 & local_318 | STR_bound_box._0_8_ & uVar26;
      uVar26 = CONCAT44(-(uint)((int)(uStack_310 >> 0x20) < SUB84(STR_bound_box._8_8_,4)),
                        -(uint)((int)uStack_310 < (int)STR_bound_box._8_8_));
      uStack_310 = ~uVar26 & uStack_310 | STR_bound_box._8_8_ & uVar26;
    }
    else {
      pgVar18 = pgVar2;
      gdsBOX::gdsBOX((gdsBOX *)pgVar2,pgVar14);
      fetch_box_bounding_box(pgVar18,(gdsBOX *)pgVar2,(int *)&local_318);
      gdsBOX::~gdsBOX((gdsBOX *)pgVar2);
      bVar5 = true;
    }
    pgVar8 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  lVar15 = *(long *)&pgVar8[lVar12].PATH.super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>.
                     _M_impl.super__Vector_impl_data;
  iVar6 = (uint)local_318;
  iVar29 = local_318._4_4_;
  iVar30 = (uint)uStack_310;
  iVar17 = uStack_310._4_4_;
  local_2d0 = lVar12 * 0xf8;
  local_270 = this;
  for (; pgVar2 = local_270, lVar12 = local_2d0,
      lVar15 != *(long *)((long)pgVar8->bounding_box + local_2d0 + 0x4c); lVar15 = lVar15 + 0x70) {
    local_2f8._0_4_ = iVar17;
    local_308._0_4_ = iVar30;
    dVar24 = round((double)*(uint *)(lVar15 + 0x10) * 0.5);
    iVar19 = (int)dVar24;
    _Var7 = std::
            __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (*(undefined8 *)(lVar15 + 0x18),*(undefined8 *)(lVar15 + 0x20));
    iVar22 = *_Var7._M_current - iVar19;
    _Var7 = std::
            __min_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (*(undefined8 *)(lVar15 + 0x30),*(undefined8 *)(lVar15 + 0x38));
    iVar21 = *_Var7._M_current - iVar19;
    _Var7 = std::
            __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (*(undefined8 *)(lVar15 + 0x18),*(undefined8 *)(lVar15 + 0x20));
    iVar20 = *_Var7._M_current + iVar19;
    _Var7 = std::
            __max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (*(undefined8 *)(lVar15 + 0x30),*(undefined8 *)(lVar15 + 0x38));
    iVar19 = iVar19 + *_Var7._M_current;
    iVar30 = local_308._0_4_;
    iVar17 = local_2f8._0_4_;
    if (!bVar5) {
      bVar5 = true;
      iVar29 = iVar21;
      iVar30 = iVar20;
      iVar17 = iVar19;
      iVar6 = iVar22;
    }
    if (iVar22 < iVar6) {
      iVar6 = iVar22;
    }
    if (iVar30 < iVar20) {
      iVar30 = iVar20;
    }
    if (iVar21 < iVar29) {
      iVar29 = iVar21;
    }
    if (iVar17 < iVar19) {
      iVar17 = iVar19;
    }
    pgVar8 = (local_270->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  uStack_310 = CONCAT44(iVar17,iVar30);
  local_318 = CONCAT44(iVar29,iVar6);
  this_00 = &local_270->STR_Lookup;
  for (lVar15 = *(long *)((long)pgVar8->bounding_box + local_2d0 + 0x5c);
      lVar15 != *(long *)((long)pgVar8->bounding_box + lVar12 + 100); lVar15 = lVar15 + 0x78) {
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)(lVar15 + 8));
    iVar6 = *pmVar9;
    if ((long)iVar6 == 1000000000) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Error: reference to structure with no name.")
      ;
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&std::cout,"Terminating SREF bounding box check.");
      std::endl<char,std::char_traits<char>>(poVar10);
      pgVar8 = (pgVar2->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
               super__Vector_impl_data._M_start;
      break;
    }
    piVar1 = (pgVar2->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start[iVar6].bounding_box;
    local_328 = *piVar1;
    iStack_324 = piVar1[1];
    iStack_320 = piVar1[2];
    auVar4 = *(undefined1 (*) [12])piVar1;
    iVar29 = piVar1[3];
    auVar27._0_4_ = -(uint)(local_328 == 0);
    auVar27._4_4_ = -(uint)(iStack_324 == 0);
    auVar27._8_4_ = -(uint)(iStack_320 == 0);
    auVar27._12_4_ = -(uint)(iVar29 == 0);
    iVar6 = movmskps(iVar6 * 0xf8,auVar27);
    if (iVar6 == 0xf) {
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "Warning: Inaccuracy due to structures not being initialized.");
      std::endl<char,std::char_traits<char>>(poVar10);
      local_328 = auVar4._0_4_;
      iStack_324 = auVar4._4_4_;
      iStack_320 = auVar4._8_4_;
    }
    iVar6 = -iStack_324;
    iVar30 = -iVar29;
    if (*(char *)(lVar15 + 0x30) == '\0') {
      iVar6 = iVar29;
      iVar30 = iStack_324;
    }
    dVar24 = *(double *)(lVar15 + 0x38);
    local_308._0_8_ = dVar24 * (double)local_328;
    register0x00001288 = dVar24 * (double)iVar30;
    if ((dVar24 == 1.0) && (!NAN(dVar24))) {
      register0x00001288 = (double)iVar30;
      local_308._0_8_ = (double)local_328;
    }
    local_2f8._0_8_ = dVar24 * (double)iStack_320;
    register0x00001248 = dVar24 * (double)iVar6;
    if ((dVar24 == 1.0) && (!NAN(dVar24))) {
      local_2f8._0_8_ = (double)iStack_320;
      unique0x1000160a = (double)iVar6;
    }
    uVar16 = (uint)*(double *)(lVar15 + 0x40);
    if (0 < (int)uVar16) {
      uVar39 = 0x167;
      if (0x167 < uVar16) {
        uVar39 = uVar16;
      }
      dVar24 = ((double)(int)((uVar39 % 0x168 - uVar39) + uVar16) * 3.141592653589) / 180.0;
      local_2e8 = cos(dVar24);
      local_1e8 = sin(dVar24);
      uStack_204 = uStack_2fc ^ 0x80000000;
      uStack_1fc = uStack_2fc ^ 0x80000000;
      local_208 = local_308._8_4_;
      uStack_200 = local_308._8_4_;
      local_1f8 = sin(dVar24);
      local_238 = cos(dVar24);
      local_288 = cos(dVar24);
      local_218 = sin(dVar24);
      uStack_244 = uStack_2ec ^ 0x80000000;
      uStack_23c = uStack_2ec ^ 0x80000000;
      local_248 = local_2f8._8_4_;
      uStack_240 = local_2f8._8_4_;
      local_228 = sin(dVar24);
      dVar24 = cos(dVar24);
      auVar32._0_8_ =
           local_2e8 * (double)local_308._0_8_ + (double)CONCAT44(uStack_204,local_208) * local_1e8;
      auVar32._8_8_ = local_1f8 * (double)local_308._0_8_ + local_238 * stack0xfffffffffffffd00;
      auVar34._0_8_ =
           local_288 * (double)local_2f8._0_8_ + (double)CONCAT44(uStack_244,local_248) * local_218;
      auVar34._8_8_ = local_228 * (double)local_2f8._0_8_ + dVar24 * stack0xfffffffffffffd10;
      auVar37._8_8_ = auVar32._8_8_;
      auVar37._0_8_ = auVar32._0_8_;
      _local_2f8 = maxpd(auVar37,auVar34);
      _local_308 = minpd(auVar34,auVar32);
    }
    dVar24 = round(local_308._0_8_);
    dVar25 = round(stack0xfffffffffffffd00);
    iVar6 = (int)*(undefined8 *)(lVar15 + 0x48);
    iVar29 = (int)((ulong)*(undefined8 *)(lVar15 + 0x48) >> 0x20);
    local_308._4_4_ = (int)dVar25 + iVar29;
    local_308._0_4_ = (int)dVar24 + iVar6;
    stack0xfffffffffffffd00 = 0.0;
    local_2e8 = round((double)local_2f8._0_8_);
    dStack_2e0 = extraout_XMM0_Qb;
    dVar24 = round(stack0xfffffffffffffd10);
    iVar6 = (int)local_2e8 + iVar6;
    iVar29 = (int)dVar24 + iVar29;
    uVar26 = CONCAT44(iVar29,iVar6);
    if (bVar5) {
    }
    else {
      bVar5 = true;
      uStack_310 = uVar26;
      local_318._0_4_ = local_308._0_4_;
      local_318._4_4_ = local_308._4_4_;
    }
    uVar36 = CONCAT44(-(uint)((int)(uStack_310 >> 0x20) < iVar29),-(uint)((int)uStack_310 < iVar6));
    uStack_310 = ~uVar36 & uStack_310 | uVar26 & uVar36;
    local_318 = CONCAT44(~-(uint)((int)local_308._4_4_ < (int)local_318._4_4_) & local_318._4_4_ |
                         local_308._4_4_ & -(uint)((int)local_308._4_4_ < (int)local_318._4_4_),
                         ~-(uint)((int)local_308._0_4_ < (int)(uint)local_318) & (uint)local_318 |
                         local_308._0_4_ & -(uint)((int)local_308._0_4_ < (int)(uint)local_318));
    pgVar8 = (pgVar2->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  lVar15 = *(long *)((long)pgVar8->bounding_box + lVar12 + 0x74);
  do {
    if (lVar15 == *(long *)((long)pgVar8->bounding_box + lVar12 + 0x7c)) {
LAB_001105da:
      *(ulong *)local_278 = local_318;
      *(ulong *)(local_278 + 2) = uStack_310;
      return 0;
    }
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)(lVar15 + 8));
    lVar11 = (long)*pmVar9;
    if (lVar11 == 1000000000) {
      poVar10 = std::operator<<((ostream *)&std::cout,"Error: reference to structure with no name.")
      ;
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&std::cout,"Terminating AREF bounding box check.");
      std::endl<char,std::char_traits<char>>(poVar10);
      goto LAB_001105da;
    }
    pgVar8 = (pgVar2->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = *(undefined8 *)pgVar8[lVar11].bounding_box;
    piVar1 = pgVar8[lVar11].bounding_box + 2;
    local_308._0_4_ = *piVar1;
    local_308._4_4_ = piVar1[1];
    local_308._8_4_ = 0;
    uStack_2fc = 0;
    iVar29 = (int)uVar3;
    auVar28._0_4_ = -(uint)(iVar29 == 0);
    iVar30 = (int)((ulong)uVar3 >> 0x20);
    auVar28._4_4_ = -(uint)(iVar30 == 0);
    auVar28._8_4_ = -(uint)(local_308._0_4_ == 0);
    auVar28._12_4_ = -(uint)(local_308._4_4_ == 0);
    iVar6 = movmskps(*pmVar9 * 0xf8,auVar28);
    if (iVar6 == 0xf) {
      stack0xfffffffffffffd00 = 0.0;
      local_308._0_8_ = *(ulong *)piVar1;
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "Warning: Structure being referenced for AREF does not have an initialized"
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "bounding box. Therefore, bounding boxes of references will be inaccurate."
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
      poVar10 = std::operator<<((ostream *)&std::cout,
                                "Calculate bounding boxes from the lowest level (unreferenced) upwards."
                               );
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    local_2e8 = *(double *)(lVar15 + 0x38);
    dStack_2e0 = 0.0;
    local_258.x = (double)(int)*(undefined8 *)(lVar15 + 0x58);
    local_258.y = (double)(int)((ulong)*(undefined8 *)(lVar15 + 0x58) >> 0x20);
    local_268.x = (double)(int)*(undefined8 *)(lVar15 + 0x60);
    local_268.y = (double)(int)((ulong)*(undefined8 *)(lVar15 + 0x60) >> 0x20);
    local_288 = (double)-(int)local_2e8;
    local_2f8._0_8_ = (undefined8)(int)*(undefined8 *)(lVar15 + 0x50);
    dVar24 = (double)(int)((ulong)*(undefined8 *)(lVar15 + 0x50) >> 0x20);
    stack0xfffffffffffffd10 = dVar24;
    local_308._4_4_ = local_308._4_4_ - iVar30;
    local_308._0_4_ = local_308._0_4_ - iVar29;
    rotate_point((double)local_2f8._0_8_,dVar24,local_288,&local_258);
    rotate_point((double)local_2f8._0_8_,dVar24,local_288,&local_268);
    auVar27 = _local_2f8;
    auVar33._0_8_ = local_258.x - (double)local_2f8._0_8_;
    auVar33._8_8_ = local_268.y - stack0xfffffffffffffd10;
    auVar38._0_8_ = (double)(int)*(undefined8 *)(lVar15 + 0x48);
    auVar38._8_8_ = (double)(int)((ulong)*(undefined8 *)(lVar15 + 0x48) >> 0x20);
    auVar34 = divpd(auVar33,auVar38);
    local_2b8.x = (double)local_308._0_4_ + (local_258.x - auVar34._0_8_);
    local_2a8.y = (double)local_308._4_4_ + (local_268.y - auVar34._8_8_);
    STR_bound_box[0] = local_2f8._0_4_;
    STR_bound_box[1] = local_2f8._4_4_;
    STR_bound_box._8_8_ = stack0xfffffffffffffd10;
    local_2b8.y = stack0xfffffffffffffd10;
    local_298.x = (double)local_2f8._0_8_;
    stack0xfffffffffffffd00 = (double)(int)dStack_2e0;
    local_308._0_8_ = (double)(int)local_2e8;
    uVar3 = local_2f8._0_8_;
    _local_2f8 = auVar27;
    local_2a8.x = local_2b8.x;
    local_298.y = local_2a8.y;
    rotate_point((double)uVar3,dVar24,(double)(int)local_2e8,(POINT *)STR_bound_box);
    rotate_point((double)local_2f8._0_8_,dVar24,(double)local_308._0_8_,&local_2b8);
    rotate_point((double)local_2f8._0_8_,dVar24,(double)local_308._0_8_,&local_2a8);
    rotate_point((double)local_2f8._0_8_,dVar24,(double)local_308._0_8_,&local_298);
    uVar39 = (uint)(double)STR_bound_box._0_8_;
    uVar40 = (uint)(double)STR_bound_box._8_8_;
    uVar16 = (int)local_2b8.y;
    if (local_2b8.y <= (double)(int)uVar40) {
      uVar16 = uVar40;
    }
    uVar23 = -(uint)(local_2b8.x < (double)(int)uVar39);
    uVar31 = -(uint)(local_2b8.y < (double)(int)uVar40);
    uVar26 = CONCAT44(~uVar31 & uVar40,~uVar23 & uVar39) |
             CONCAT44((int)local_2b8.y & uVar31,(int)local_2b8.x & uVar23);
    uVar40 = (uint)uVar26;
    uVar23 = (uint)(uVar26 >> 0x20);
    uVar31 = -(uint)(local_2a8.x < (double)(int)uVar40);
    uVar35 = -(uint)(local_2a8.y < (double)(int)uVar23);
    uVar40 = ~uVar31 & uVar40 | (int)local_2a8.x & uVar31;
    uVar23 = ~uVar35 & uVar23 | (int)local_2a8.y & uVar35;
    uVar31 = -(uint)((double)(int)uVar39 < local_2b8.x);
    uVar31 = ~uVar31 & uVar39 | (int)local_2b8.x & uVar31;
    uVar35 = ~-(uint)((double)(int)uVar16 < local_2a8.y) & uVar16 |
             (int)local_2a8.y & -(uint)((double)(int)uVar16 < local_2a8.y);
    uVar16 = -(uint)((double)(int)uVar31 < local_2a8.x);
    uVar39 = -(uint)((double)(int)uVar35 < local_298.y);
    uVar31 = ~uVar16 & uVar31 | (int)local_2a8.x & uVar16;
    uVar35 = ~uVar39 & uVar35 | (int)local_298.y & uVar39;
    uVar16 = (int)((uint)(byte)(-(local_298.x < (double)(int)uVar40) |
                               (double)(int)uVar31 < local_298.x) << 0x1f) >> 0x1f;
    uVar39 = (int)((uint)(local_298.y < (double)(int)uVar23) * -0x80000000) >> 0x1f;
    uVar16 = ~uVar16 & uVar40 | (int)local_298.x & uVar16;
    uVar39 = ~uVar39 & uVar23 | (int)local_298.y & uVar39;
    if (bVar5) {
    }
    else {
      bVar5 = true;
      local_318._0_4_ = uVar16;
      local_318._4_4_ = uVar39;
      uStack_310._0_4_ = uVar31;
      uStack_310._4_4_ = uVar35;
    }
    local_318 = CONCAT44(~-(uint)((int)uVar39 < (int)local_318._4_4_) & local_318._4_4_ |
                         uVar39 & -(uint)((int)uVar39 < (int)local_318._4_4_),
                         ~-(uint)((int)uVar16 < (int)(uint)local_318) & (uint)local_318 |
                         uVar16 & -(uint)((int)uVar16 < (int)(uint)local_318));
    uStack_310 = CONCAT44(~-(uint)((int)uStack_310._4_4_ < (int)uVar35) & uStack_310._4_4_ |
                          uVar35 & -(uint)((int)uStack_310._4_4_ < (int)uVar35),
                          ~-(uint)((int)(uint)uStack_310 < (int)uVar31) & (uint)uStack_310 |
                          uVar31 & -(uint)((int)(uint)uStack_310 < (int)uVar31));
    pgVar8 = (pgVar2->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = lVar15 + 0x90;
  } while( true );
}

Assistant:

int gdscpp::calculate_STR_bounding_box(int structure_index, int *destination)
{
  int bound_box[4]; // xmin, ymin, xmax, ymax of structure
  bool box_initialized = false;
  // ======================= Look through boundaries =======================
  auto boundary_iterator = STR[structure_index].BOUNDARY.begin();
  while (boundary_iterator != STR[structure_index].BOUNDARY.end()) {
    int STR_bound_box[4];
    if (box_initialized == false) {
      // Initialize bounding box
      fetch_boundary_bounding_box(*boundary_iterator, bound_box);
      box_initialized = true;
    } else {
      // Compare for minimum/maximums
      fetch_boundary_bounding_box(*boundary_iterator, STR_bound_box);
      if (STR_bound_box[0] < bound_box[0])
        bound_box[0] = STR_bound_box[0];
      if (STR_bound_box[1] < bound_box[1])
        bound_box[1] = STR_bound_box[1];
      if (STR_bound_box[2] > bound_box[2])
        bound_box[2] = STR_bound_box[2];
      if (STR_bound_box[3] > bound_box[3])
        bound_box[3] = STR_bound_box[3];
    }
    boundary_iterator++;
  }
  // ========================= Look through boxes ==========================
  auto box_iter = STR[structure_index].BOX.begin();
  while (box_iter != STR[structure_index].BOX.end()) {
    int BOX_bound_box[4];
    if (box_initialized == false) {
      fetch_box_bounding_box(*box_iter, bound_box);
      box_initialized = true;
    } else {
      fetch_box_bounding_box(*box_iter, BOX_bound_box);
      if (BOX_bound_box[0] < bound_box[0])
        bound_box[0] = BOX_bound_box[0];
      if (BOX_bound_box[1] < bound_box[1])
        bound_box[1] = BOX_bound_box[1];
      if (BOX_bound_box[2] > bound_box[2])
        bound_box[2] = BOX_bound_box[2];
      if (BOX_bound_box[3] > bound_box[3])
        bound_box[3] = BOX_bound_box[3];
    }
    box_iter++;
  }
  // ========================= Look through paths ==========================
  auto path_iter = STR[structure_index].PATH.begin();
  while (path_iter != STR[structure_index].PATH.end()) {
    // Neglect path type. Simplify work by assuming max half-width protrusion.
    // Worst case scenario is that the bounding box is ever so slightly
    // bigger than actually needed for a flat-cap situation.
    int offset = (int)(round(((double)path_iter->width * 0.5)));
    int local_bbox[4] = {
        (*min_element(path_iter->xCor.begin(), path_iter->xCor.end()) - offset),
        (*min_element(path_iter->yCor.begin(), path_iter->yCor.end()) - offset),
        (*max_element(path_iter->xCor.begin(), path_iter->xCor.end()) + offset),
        (*max_element(path_iter->yCor.begin(), path_iter->yCor.end()) +
         offset)};
    if (box_initialized == false) {
      bound_box[0] = local_bbox[0];
      bound_box[1] = local_bbox[1];
      bound_box[2] = local_bbox[2];
      bound_box[3] = local_bbox[3];
      box_initialized = true;
    }
    if (local_bbox[0] < bound_box[0])
      bound_box[0] = local_bbox[0]; // new minimum
    if (local_bbox[2] > bound_box[2])
      bound_box[2] = local_bbox[2]; // new maximum
    if (local_bbox[1] < bound_box[1])
      bound_box[1] = local_bbox[1];
    if (local_bbox[3] > bound_box[3])
      bound_box[3] = local_bbox[3];
    path_iter++;
  }
  // ================== Look through structure references ==================
  auto SREF_iter = STR[structure_index].SREF.begin();
  while (SREF_iter != STR[structure_index].SREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[SREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating SREF bounding box check." << endl;
      break;
    }
    int referred_bound_box[4];
    referred_bound_box[0] = STR[target_structure_index].bounding_box[0];
    referred_bound_box[1] = STR[target_structure_index].bounding_box[1];
    referred_bound_box[2] = STR[target_structure_index].bounding_box[2];
    referred_bound_box[3] = STR[target_structure_index].bounding_box[3];

    if ((referred_bound_box[0] == 0) && (referred_bound_box[1] == 0) &&
        (referred_bound_box[2] == 0) && (referred_bound_box[3] == 0)) {
      // cout << "Warning: Structure being referenced does not have an
      // initialized"
      //      << endl;
      // cout << "bounding box. Therefore, bounding boxes of references will be
      // "
      //         "inaccurate."
      //      << endl;
      // cout << "Calculate bounding boxes from the lowest level (unreferenced)
      // "
      //         "upwards."
      //      << endl;
      cout << "Warning: Inaccuracy due to structures not being initialized."
           << endl;
    }
    if (SREF_iter->reflection == true) // Reflect about x-axis
    {
      // Reflect the box about x-axis and swap because max becomes min
      int placeholder = referred_bound_box[1];
      referred_bound_box[1] = -1 * referred_bound_box[3];
      referred_bound_box[3] = -1 * placeholder;
    }
    double x_1 = referred_bound_box[0];
    double y_1 = referred_bound_box[1];
    double x_2 = referred_bound_box[2];
    double y_2 = referred_bound_box[3];
    if (SREF_iter->scale != 1) // Multiply by scale factor
    {
      x_1 = x_1 * SREF_iter->scale;
      x_2 = x_2 * SREF_iter->scale;
      y_1 = y_1 * SREF_iter->scale;
      y_2 = y_2 * SREF_iter->scale;
    }
    // Rotate
    int angle = SREF_iter->angle;
    if (angle > 0) {
      while (angle >= 360) {
        angle = angle - 360;
      }
      double x_1_new = x_1 * cos(angle * 3.141592653589 / 180) -
                       y_1 * sin(angle * 3.141592653589 / 180);
      double y_1_new = x_1 * sin(angle * 3.141592653589 / 180) +
                       y_1 * cos(angle * 3.141592653589 / 180);
      double x_2_new = x_2 * cos(angle * 3.141592653589 / 180) -
                       y_2 * sin(angle * 3.141592653589 / 180);
      double y_2_new = x_2 * sin(angle * 3.141592653589 / 180) +
                       y_2 * cos(angle * 3.141592653589 / 180);
      x_1 = x_1_new;
      y_1 = y_1_new;
      x_2 = x_2_new;
      y_2 = y_2_new;
      // convert back to vertical box by getting the new minimum and maximum
      if (x_1 > x_2) {
        double temp_holder = x_2;
        x_2 = x_1;
        x_1 = temp_holder;
      }
      if (y_1 > y_2) {
        double temp_holder2 = y_2;
        y_2 = y_1;
        y_1 = temp_holder2;
      }
    }
    // Offset shape according to translation
    referred_bound_box[0] = (int)(round(x_1)) + SREF_iter->xCor;
    referred_bound_box[1] = (int)(round(y_1)) + SREF_iter->yCor;
    referred_bound_box[2] = (int)(round(x_2)) + SREF_iter->xCor;
    referred_bound_box[3] = (int)(round(y_2)) + SREF_iter->yCor;

    if (box_initialized == false) {
      bound_box[0] = referred_bound_box[0];
      bound_box[1] = referred_bound_box[1];
      bound_box[2] = referred_bound_box[2];
      bound_box[3] = referred_bound_box[3];
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (referred_bound_box[0] < bound_box[0])
      bound_box[0] = referred_bound_box[0]; // new minimum
    if (referred_bound_box[2] > bound_box[2])
      bound_box[2] = referred_bound_box[2]; // new maximum
    if (referred_bound_box[1] < bound_box[1])
      bound_box[1] = referred_bound_box[1];
    if (referred_bound_box[3] > bound_box[3])
      bound_box[3] = referred_bound_box[3];

    SREF_iter++;
  }
  // ==================== Look through array references ====================
  auto AREF_iter = STR[structure_index].AREF.begin();
  while (AREF_iter != STR[structure_index].AREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[AREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating AREF bounding box check." << endl;
      break;
    }
    // fetch bounding box of the array reference structure
    int a_referred_bound_box[4] = {STR[target_structure_index].bounding_box[0],
                                   STR[target_structure_index].bounding_box[1],
                                   STR[target_structure_index].bounding_box[2],
                                   STR[target_structure_index].bounding_box[3]};
    if ((a_referred_bound_box[0] == 0) && (a_referred_bound_box[1] == 0) &&
        (a_referred_bound_box[2] == 0) && (a_referred_bound_box[3] == 0)) {
      cout << "Warning: Structure being referenced for AREF does not have an "
              "initialized"
           << endl;
      cout << "bounding box. Therefore, bounding boxes of references will be "
              "inaccurate."
           << endl;
      cout << "Calculate bounding boxes from the lowest level (unreferenced) "
              "upwards."
           << endl;
    }
    // Rotate array reference back to original dimensions
    POINT cor, corRow, corCol, true_max;
    POINT enclosed_array[4];
    int aref_angle = AREF_iter->angle;
    cor.x = (double)AREF_iter->xCor;
    cor.y = (double)AREF_iter->yCor;
    corRow.x = (double)AREF_iter->xCorRow;
    corRow.y = (double)AREF_iter->yCorRow;
    corCol.x = (double)AREF_iter->xCorCol;
    corCol.y = (double)AREF_iter->yCorCol;
    rotate_point(cor.x, cor.y, (-aref_angle), corRow);
    rotate_point(cor.x, cor.y, (-aref_angle), corCol);
    // Determine the true endpoints (without blank space at end)
    int referred_structure_width =
        a_referred_bound_box[2] - a_referred_bound_box[0];
    int referred_structure_height =
        a_referred_bound_box[3] - a_referred_bound_box[1];
    double column_spacing = (corRow.x - cor.x) / AREF_iter->colCnt;
    double row_spacing = (corCol.y - cor.y) / AREF_iter->rowCnt;
    true_max.x = corRow.x - column_spacing + referred_structure_width;
    true_max.y = corCol.y - row_spacing + referred_structure_height;
    enclosed_array[0].x = cor.x;
    enclosed_array[0].y = cor.y;
    enclosed_array[1].x = true_max.x;
    enclosed_array[1].y = cor.y;
    enclosed_array[2].x = true_max.x;
    enclosed_array[2].y = true_max.y;
    enclosed_array[3].x = cor.x;
    enclosed_array[3].y = true_max.y;
    // Rotate the 4 points of the box to their correct positions
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[0]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[1]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[2]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[3]);
    // Determine min/maxes for new box
    int x_min, y_min, x_max, y_max;
    x_min = (int)enclosed_array[0].x;
    if (enclosed_array[1].x < (double)x_min)
      x_min = (int)enclosed_array[1].x;
    if (enclosed_array[2].x < (double)x_min)
      x_min = (int)enclosed_array[2].x;
    if (enclosed_array[3].x < (double)x_min)
      x_min = (int)enclosed_array[3].x;

    x_max = (int)enclosed_array[0].x;
    if (enclosed_array[1].x > (double)x_max)
      x_max = (int)enclosed_array[1].x;
    if (enclosed_array[2].x > (double)x_max)
      x_max = (int)enclosed_array[2].x;
    if (enclosed_array[3].x > (double)x_max)
      x_min = (int)enclosed_array[3].x;

    y_min = (int)enclosed_array[0].y;
    if (enclosed_array[1].y < (double)y_min)
      y_min = (int)enclosed_array[1].y;
    if (enclosed_array[2].y < (double)y_min)
      y_min = (int)enclosed_array[2].y;
    if (enclosed_array[3].y < (double)y_min)
      y_min = (int)enclosed_array[3].y;

    y_max = (int)enclosed_array[0].y;
    if (enclosed_array[1].y > (double)y_max)
      y_max = (int)enclosed_array[1].y;
    if (enclosed_array[2].y > (double)y_max)
      y_max = (int)enclosed_array[2].y;
    if (enclosed_array[3].y > (double)y_max)
      y_max = (int)enclosed_array[3].y;

    // Do the comparison against the structure bounding box
    if (box_initialized == false) {
      bound_box[0] = x_min;
      bound_box[1] = y_min;
      bound_box[2] = x_max;
      bound_box[3] = y_max;
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (x_min < bound_box[0])
      bound_box[0] = x_min; // new minimum
    if (x_max > bound_box[2])
      bound_box[2] = x_max; // new maximum
    if (y_min < bound_box[1])
      bound_box[1] = y_min;
    if (y_max > bound_box[3])
      bound_box[3] = y_max;
    AREF_iter++;
  }
  // =============== Send the bounding box to specified array ==============
  destination[0] = bound_box[0];
  destination[1] = bound_box[1];
  destination[2] = bound_box[2];
  destination[3] = bound_box[3];
  return EXIT_SUCCESS;
}